

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O3

int remux_tiles(CommonTileParams *tiles,uint8_t *dst,uint32_t data_size,uint32_t max_tile_size,
               uint32_t max_tile_col_size,int *tile_size_bytes,int *tile_col_size_bytes)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  
  if (tiles->large_scale == 0) {
    if (0xffffff < max_tile_size) {
      *tile_size_bytes = 4;
      *tile_col_size_bytes = 4;
      return data_size;
    }
    iVar4 = 3;
    iVar2 = 4;
    if (max_tile_size < 0x10000) {
      iVar4 = 2 - (uint)(max_tile_size < 0x100);
    }
  }
  else {
    if ((int)max_tile_size < 0) {
      iVar4 = -1;
    }
    else {
      iVar4 = 4;
      if ((max_tile_size < 0x800000) && (iVar4 = 3, max_tile_size < 0x8000)) {
        iVar4 = 2 - (uint)(max_tile_size < 0x80);
      }
    }
    if (0xffffff < max_tile_col_size) {
      *tile_size_bytes = iVar4;
      *tile_col_size_bytes = 4;
      iVar2 = 4;
      if (iVar4 == 4) {
        return data_size;
      }
      goto LAB_0019e41f;
    }
    iVar2 = 3;
    if (max_tile_col_size < 0x10000) {
      iVar2 = 2 - (uint)(max_tile_col_size < 0x100);
    }
  }
  *tile_size_bytes = iVar4;
  *tile_col_size_bytes = iVar2;
LAB_0019e41f:
  iVar7 = tiles->cols;
  if (tiles->large_scale == 0) {
    iVar7 = iVar7 * tiles->rows;
    if (0 < iVar7) {
      uVar9 = 0;
      uVar6 = 0;
      do {
        if (iVar7 == 1) {
          iVar2 = data_size - uVar9;
        }
        else {
          uVar1 = (ulong)uVar9;
          if (iVar4 - 1U < 4) {
            iVar2 = (*(code *)(&DAT_004d7b20 + *(int *)(&DAT_004d7b20 + (ulong)(iVar4 - 1U) * 4)))()
            ;
            return iVar2;
          }
          uVar9 = uVar9 + 4;
          iVar2 = *(int *)(dst + uVar1) + 1;
          uVar6 = (ulong)(uint)((int)uVar6 + iVar4);
        }
        memmove(dst + uVar6,dst + uVar9,(long)iVar2);
        uVar9 = uVar9 + iVar2;
        uVar5 = iVar2 + (int)uVar6;
        uVar6 = (ulong)uVar5;
        iVar7 = iVar7 + -1;
      } while (iVar7 != 0);
      return uVar5;
    }
  }
  else if (0 < iVar7) {
    iVar3 = tiles->rows;
    iVar8 = 0;
    uVar6 = 0;
    uVar1 = 0;
    do {
      if (iVar8 < iVar7 + -1) {
        dst[uVar1] = (char)iVar3 * ((char)iVar4 + -4) + (char)*(undefined4 *)(dst + uVar6);
        iVar2 = (*(code *)(&DAT_004d7af0 + *(int *)(&DAT_004d7af0 + (ulong)(iVar2 - 1) * 4)))
                          (tiles,1,dst + uVar1,8,
                           &DAT_004d7af0 + *(int *)(&DAT_004d7af0 + (ulong)(iVar2 - 1) * 4));
        return iVar2;
      }
      if (0 < iVar3) {
        iVar7 = 0;
        do {
          uVar9 = *(uint *)(dst + uVar6);
          uVar5 = (int)uVar6 + 4;
          uVar6 = (ulong)uVar5;
          if ((int)uVar9 < 0) {
            uVar5 = uVar9 >> ((char)iVar4 * -8 + 0x20U & 0x1f);
            switch(iVar4) {
            case 1:
              dst[uVar1] = (uint8_t)uVar5;
              break;
            case 2:
              *(short *)(dst + uVar1) = (short)uVar5;
              break;
            case 3:
              dst[uVar1] = (uint8_t)uVar5;
              dst[uVar1 + 1] = (uint8_t)(uVar5 >> 8);
              dst[uVar1 + 2] = (uint8_t)(uVar5 >> 0x10);
              break;
            case 4:
              *(uint *)(dst + uVar1) = uVar9;
            }
            uVar10 = (int)uVar1 + iVar4;
          }
          else {
            switch(iVar4) {
            case 1:
              dst[uVar1] = (uint8_t)uVar9;
              break;
            case 2:
              *(short *)(dst + uVar1) = (short)uVar9;
              break;
            case 3:
              dst[uVar1] = (uint8_t)uVar9;
              dst[uVar1 + 1] = (uint8_t)(uVar9 >> 8);
              dst[uVar1 + 2] = (uint8_t)(uVar9 >> 0x10);
              break;
            case 4:
              *(uint *)(dst + uVar1) = uVar9;
            }
            uVar10 = (int)uVar1 + iVar4;
            memmove(dst + uVar10,dst + uVar6,(ulong)uVar9 + 1);
            iVar3 = (int)((ulong)uVar9 + 1);
            uVar6 = (ulong)(uVar5 + iVar3);
            uVar10 = uVar10 + iVar3;
          }
          uVar1 = (ulong)uVar10;
          iVar7 = iVar7 + 1;
          iVar3 = tiles->rows;
        } while (iVar7 < iVar3);
      }
      iVar8 = iVar8 + 1;
      iVar7 = tiles->cols;
    } while (iVar8 < iVar7);
    return (int)uVar1;
  }
  return 0;
}

Assistant:

static int remux_tiles(const CommonTileParams *const tiles, uint8_t *dst,
                       const uint32_t data_size, const uint32_t max_tile_size,
                       const uint32_t max_tile_col_size,
                       int *const tile_size_bytes,
                       int *const tile_col_size_bytes) {
  // Choose the tile size bytes (tsb) and tile column size bytes (tcsb)
  int tsb;
  int tcsb;

  if (tiles->large_scale) {
    // The top bit in the tile size field indicates tile copy mode, so we
    // have 1 less bit to code the tile size
    tsb = choose_size_bytes(max_tile_size, 1);
    tcsb = choose_size_bytes(max_tile_col_size, 0);
  } else {
    tsb = choose_size_bytes(max_tile_size, 0);
    tcsb = 4;  // This is ignored
    (void)max_tile_col_size;
  }

  assert(tsb > 0);
  assert(tcsb > 0);

  *tile_size_bytes = tsb;
  *tile_col_size_bytes = tcsb;
  if (tsb == 4 && tcsb == 4) return data_size;

  uint32_t wpos = 0;
  uint32_t rpos = 0;

  if (tiles->large_scale) {
    int tile_row;
    int tile_col;

    for (tile_col = 0; tile_col < tiles->cols; tile_col++) {
      // All but the last column has a column header
      if (tile_col < tiles->cols - 1) {
        uint32_t tile_col_size = mem_get_le32(dst + rpos);
        rpos += 4;

        // Adjust the tile column size by the number of bytes removed
        // from the tile size fields.
        tile_col_size -= (4 - tsb) * tiles->rows;

        mem_put_varsize(dst + wpos, tcsb, tile_col_size);
        wpos += tcsb;
      }

      for (tile_row = 0; tile_row < tiles->rows; tile_row++) {
        // All, including the last row has a header
        uint32_t tile_header = mem_get_le32(dst + rpos);
        rpos += 4;

        // If this is a copy tile, we need to shift the MSB to the
        // top bit of the new width, and there is no data to copy.
        if (tile_header >> 31 != 0) {
          if (tsb < 4) tile_header >>= 32 - 8 * tsb;
          mem_put_varsize(dst + wpos, tsb, tile_header);
          wpos += tsb;
        } else {
          mem_put_varsize(dst + wpos, tsb, tile_header);
          wpos += tsb;

          tile_header += AV1_MIN_TILE_SIZE_BYTES;
          memmove(dst + wpos, dst + rpos, tile_header);
          rpos += tile_header;
          wpos += tile_header;
        }
      }
    }

    assert(rpos > wpos);
    assert(rpos == data_size);

    return wpos;
  }
  const int n_tiles = tiles->cols * tiles->rows;
  int n;

  for (n = 0; n < n_tiles; n++) {
    int tile_size;

    if (n == n_tiles - 1) {
      tile_size = data_size - rpos;
    } else {
      tile_size = mem_get_le32(dst + rpos);
      rpos += 4;
      mem_put_varsize(dst + wpos, tsb, tile_size);
      tile_size += AV1_MIN_TILE_SIZE_BYTES;
      wpos += tsb;
    }

    memmove(dst + wpos, dst + rpos, tile_size);

    rpos += tile_size;
    wpos += tile_size;
  }

  assert(rpos > wpos);
  assert(rpos == data_size);

  return wpos;
}